

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O2

void __thiscall FlickerRemoverCPU::~FlickerRemoverCPU(FlickerRemoverCPU *this)

{
  ~FlickerRemoverCPU(this);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

FlickerRemoverCPU::~FlickerRemoverCPU()
{
    clear();
}